

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall jbcoin::Logs::File::~File(File *this)

{
  std::__cxx11::string::~string((string *)&this->m_path);
  std::
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(&this->m_stream);
  return;
}

Assistant:

Logs::File::~File()
{
}